

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O3

void __thiscall CMU462::OSDText::~OSDText(OSDText *this)

{
  operator_delete(this->ft);
  operator_delete(this->font);
  operator_delete(this->face);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::clear(&this->lines);
  (*__glewDeleteProgram)(this->program);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete font;
  delete face;

  lines.clear();

  glDeleteProgram(program);
}